

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O3

int arkSVtolerances(ARKodeMem ark_mem,realtype reltol,N_Vector abstol)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  realtype rVar2;
  
  if (ark_mem == (ARKodeMem)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    error_code = -0x15;
  }
  else if (ark_mem->MallocDone == 0) {
    msgfmt = "Attempt to call before ARKodeInit.";
    iVar1 = -0x17;
    error_code = -0x17;
  }
  else {
    if (0.0 <= reltol) {
      if (abstol == (N_Vector)0x0) {
        msgfmt = "abstol = NULL illegal.";
      }
      else if (abstol->ops->nvmin == (_func_realtype_N_Vector *)0x0) {
        msgfmt = "Missing N_VMin routine from N_Vector";
      }
      else {
        rVar2 = N_VMin(abstol);
        if (0.0 <= rVar2) {
          ark_mem->atolmin0 = -(uint)(rVar2 == 0.0) & 1;
          if (ark_mem->VabstolMallocDone == 0) {
            iVar1 = arkAllocVec(ark_mem,ark_mem->ewt,&ark_mem->Vabstol);
            if (iVar1 == 0) {
              arkProcessError(ark_mem,-0x14,"ARKode","arkSVtolerances",
                              "Allocation of arkode_mem failed.");
              return -0x16;
            }
            ark_mem->VabstolMallocDone = 1;
          }
          N_VScale(1.0,abstol,ark_mem->Vabstol);
          ark_mem->reltol = reltol;
          ark_mem->itol = 1;
          ark_mem->user_efun = 0;
          ark_mem->efun = arkEwtSetSV;
          ark_mem->e_data = ark_mem;
          return 0;
        }
        msgfmt = "abstol has negative component(s) (illegal).";
      }
    }
    else {
      msgfmt = "reltol < 0 illegal.";
    }
    iVar1 = -0x16;
    error_code = -0x16;
  }
  arkProcessError(ark_mem,error_code,"ARKode","arkSVtolerances",msgfmt);
  return iVar1;
}

Assistant:

int arkSVtolerances(ARKodeMem ark_mem, realtype reltol, N_Vector abstol)
{
  /* local variables */
  realtype abstolmin;

  /* Check inputs */
  if (ark_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSVtolerances", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  if (ark_mem->MallocDone == SUNFALSE) {
    arkProcessError(ark_mem, ARK_NO_MALLOC, "ARKode",
                    "arkSVtolerances", MSG_ARK_NO_MALLOC);
    return(ARK_NO_MALLOC);
  }
  if (reltol < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_BAD_RELTOL);
    return(ARK_ILL_INPUT);
  }
  if (abstol == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_NULL_ABSTOL);
    return(ARK_ILL_INPUT);
  }
  if (abstol->ops->nvmin == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkSVtolerances",
                    "Missing N_VMin routine from N_Vector");
    return(ARK_ILL_INPUT);
  }
  abstolmin = N_VMin(abstol);
  if (abstolmin < ZERO) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSVtolerances", MSG_ARK_BAD_ABSTOL);
    return(ARK_ILL_INPUT);
  }

  /* Set flag indicating whether min(abstol) == 0 */
  ark_mem->atolmin0 = (abstolmin == ZERO);

  /* Copy tolerances into memory */
  if ( !(ark_mem->VabstolMallocDone) ) {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->Vabstol))) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                      "arkSVtolerances", MSG_ARK_ARKMEM_FAIL);
      return(ARK_ILL_INPUT);
    }
    ark_mem->VabstolMallocDone = SUNTRUE;
  }
  N_VScale(ONE, abstol, ark_mem->Vabstol);
  ark_mem->reltol = reltol;
  ark_mem->itol   = ARK_SV;

  /* enforce use of arkEwtSetSV */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->efun      = arkEwtSetSV;
  ark_mem->e_data    = ark_mem;

  return(ARK_SUCCESS);
}